

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void XML_DefaultCurrent(XML_Parser parser)

{
  XML_Parser parser_local;
  
  if ((parser != (XML_Parser)0x0) && (parser->m_defaultHandler != (XML_DefaultHandler)0x0)) {
    if (parser->m_openInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) {
      reportDefault(parser,parser->m_encoding,parser->m_eventPtr,parser->m_eventEndPtr);
    }
    else {
      reportDefault(parser,parser->m_internalEncoding,
                    parser->m_openInternalEntities->internalEventPtr,
                    parser->m_openInternalEntities->internalEventEndPtr);
    }
  }
  return;
}

Assistant:

void XMLCALL
XML_DefaultCurrent(XML_Parser parser)
{
  if (parser == NULL)
    return;
  if (defaultHandler) {
    if (openInternalEntities)
      reportDefault(parser,
                    internalEncoding,
                    openInternalEntities->internalEventPtr,
                    openInternalEntities->internalEventEndPtr);
    else
      reportDefault(parser, encoding, eventPtr, eventEndPtr);
  }
}